

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O1

void anon_unknown.dwarf_afcf6::writeRead
               (string *tempDir,pixelArray *array,int w,int h,int dx,int dy)

{
  pointer pcVar1;
  undefined4 in_register_0000000c;
  int comp;
  Compression comp_00;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  int xs;
  int ys;
  string filename;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar1,pcVar1 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,h),CONCAT44(in_register_00000084,dx),
             CONCAT44(in_register_0000008c,dy));
  std::__cxx11::string::append((char *)&filename);
  xs = 1;
  do {
    ys = 1;
    do {
      comp_00 = NO_COMPRESSION;
      do {
        writeRead(array,filename._M_dataplus._M_p,false,xs * 0x55b,ys * 0x9f,xs * 0x11,ys * 0x1d,
                  comp_00,xs,ys);
        if (ys == 1 && xs == 1) {
          writeRead(array,filename._M_dataplus._M_p,true,xs * 0x55b,ys * 0x9f,xs * 0x11,ys * 0x1d,
                    comp_00,1,1);
        }
        comp_00 = comp_00 + RLE_COMPRESSION;
      } while (comp_00 != NUM_COMPRESSION_METHODS);
      ys = ys + 1;
    } while (ys != 3);
    xs = xs + 1;
  } while (xs != 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
writeRead (
    const std::string& tempDir, pixelArray& array, int w, int h, int dx, int dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeRead (
                    array,
                    filename.c_str (),
                    false,
                    w * xs,
                    h * ys,
                    dx * xs,
                    dy * ys,
                    Compression (comp),
                    xs,
                    ys);

                if (xs == 1 && ys == 1)
                {
                    writeRead (
                        array,
                        filename.c_str (),
                        true,
                        w * xs,
                        h * ys,
                        dx * xs,
                        dy * ys,
                        Compression (comp),
                        xs,
                        ys);
                }
            }
        }
    }
}